

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_swap_4bytes(size_t n,void *ar)

{
  ushort *puVar1;
  undefined1 uVar2;
  size_t sVar3;
  uchar *cp0;
  
  if (n != 0) {
    sVar3 = 0;
    do {
      uVar2 = *(undefined1 *)((long)ar + sVar3 * 4);
      *(undefined1 *)((long)ar + sVar3 * 4) = *(undefined1 *)((long)ar + sVar3 * 4 + 3);
      *(undefined1 *)((long)ar + sVar3 * 4 + 3) = uVar2;
      puVar1 = (ushort *)((long)ar + sVar3 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  return;
}

Assistant:

void nifti_swap_4bytes( size_t n , void *ar )    /* 4 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0; cp2 = cp0+3;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1++;  cp2--;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp0 += 4;
   }
   return ;
}